

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idaAnalytic_mels.c
# Opt level: O0

int MatrixEmbeddedLSSolve(SUNLinearSolver LS,SUNMatrix A,N_Vector x,N_Vector b,sunrealtype tol)

{
  double dVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  long *in_RCX;
  long *in_RDX;
  undefined8 *in_RDI;
  double dVar5;
  sunrealtype TWO;
  sunrealtype ONE;
  sunrealtype b2;
  sunrealtype b1;
  sunrealtype a21;
  sunrealtype a12;
  sunrealtype a11;
  sunrealtype alpha;
  sunrealtype *rdata;
  void *user_data;
  sunrealtype cj;
  sunrealtype tcur;
  N_Vector res;
  N_Vector ypn;
  N_Vector yyn;
  N_Vector yppred;
  N_Vector yypred;
  int retval;
  double *funcname;
  double **returnvalue;
  double *local_78;
  double local_70;
  double local_68;
  undefined1 local_60 [8];
  undefined1 local_58 [8];
  undefined1 local_50 [8];
  undefined1 local_48 [8];
  undefined1 local_40 [12];
  undefined4 local_34;
  long *local_28;
  long *local_20;
  int local_4;
  
  funcname = &local_70;
  returnvalue = &local_78;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_34 = IDAGetNonlinearSystemData(*in_RDI,&local_68,local_40,local_48,local_50,local_58);
  iVar4 = check_retval(returnvalue,(char *)funcname,(int)((ulong)local_60 >> 0x20));
  if (iVar4 == 0) {
    dVar1 = *local_78;
    dVar5 = local_68 + 2.0;
    dVar2 = **(double **)(*local_28 + 0x10);
    dVar3 = *(double *)(*(long *)(*local_28 + 0x10) + 8);
    **(double **)(*local_20 + 0x10) = dVar3 / dVar5;
    *(double *)(*(long *)(*local_20 + 0x10) + 8) =
         -(((-local_70 - (dVar1 - 1.0) / (local_68 - 2.0)) - 1.0) * dVar3 + -(dVar5 * dVar2)) /
         ((dVar1 - 1.0) * dVar5);
    local_4 = 0;
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

static int MatrixEmbeddedLSSolve(SUNLinearSolver LS, SUNMatrix A, N_Vector x,
                                 N_Vector b, sunrealtype tol)
{
  /* temporary variables */
  int retval;
  N_Vector yypred, yppred, yyn, ypn, res;
  sunrealtype tcur, cj;
  void* user_data;
  sunrealtype* rdata;
  sunrealtype alpha;
  sunrealtype a11, a12, a21, b1, b2;
  sunrealtype ONE = SUN_RCONST(1.0);
  sunrealtype TWO = SUN_RCONST(2.0);

  /* retrieve implicit system data from IDA */
  retval = IDAGetNonlinearSystemData(LS->content, &tcur, &yypred, &yppred, &yyn,
                                     &ypn, &res, &cj, &user_data);
  if (check_retval((void*)&retval, "IDAGetNonlinearSystemData", 1))
  {
    return (-1);
  }

  /* extract stiffness parameter from user_data */
  rdata = (sunrealtype*)user_data;
  alpha = rdata[0];

  /* perform linear solve: A*x=b
         A = df/dy + cj*df/dyp
      =>
         A = [ - cj - (alpha - 1)/(t - 2) - 1, alpha - 1]
             [                          t + 2,         0]

   */
  a11            = -cj - (alpha - ONE) / (tcur - TWO) - ONE;
  a12            = alpha - ONE;
  a21            = tcur + TWO;
  b1             = NV_Ith_S(b, 0);
  b2             = NV_Ith_S(b, 1);
  NV_Ith_S(x, 0) = b2 / a21;
  NV_Ith_S(x, 1) = -(a11 * b2 - a21 * b1) / (a12 * a21);

  /* return with success */
  return (SUN_SUCCESS);
}